

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O2

void __thiscall btMatrixX<float>::resize(btMatrixX<float> *this,int rows,int cols)

{
  CProfileSample __profile;
  CProfileSample local_1d;
  float local_1c;
  
  this->m_resizeOperations = this->m_resizeOperations + 1;
  this->m_rows = rows;
  this->m_cols = cols;
  CProfileManager::Start_Profile("m_storage.resize");
  local_1c = 0.0;
  btAlignedObjectArray<float>::resize(&this->m_storage,cols * rows,&local_1c);
  CProfileSample::~CProfileSample(&local_1d);
  return;
}

Assistant:

void resize(int rows, int cols)
	{
		m_resizeOperations++;
		m_rows = rows;
		m_cols = cols;
		{
			BT_PROFILE("m_storage.resize");
			m_storage.resize(rows*cols);
		}
	}